

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void TrueMotion(uint8_t *dst,uint8_t *left,uint8_t *top,int size)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (left == (uint8_t *)0x0) {
    if (top != (uint8_t *)0x0) {
      VerticalPred(dst,top,size);
      return;
    }
    Fill(dst,0x81,size);
    return;
  }
  if (top != (uint8_t *)0x0) {
    bVar1 = left[-1];
    uVar3 = 0;
    uVar4 = 0;
    if (0 < size) {
      uVar4 = (ulong)(uint)size;
    }
    for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      bVar2 = left[uVar3];
      for (uVar5 = 0; (uint)size != uVar5; uVar5 = uVar5 + 1) {
        dst[uVar5] = clip1[(ulong)top[uVar5] + (ulong)bVar2 + (0xff - (ulong)bVar1)];
      }
      dst = dst + 0x20;
    }
    return;
  }
  HorizontalPred(dst,left,size);
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const uint8_t* const clip0 = VP8kclip1 - top[-1];
  int y;
  for (y = 0; y < size; ++y) {
    const uint8_t* const clip = clip0 + dst[-1];
    int x;
    for (x = 0; x < size; ++x) {
      dst[x] = clip[top[x]];
    }
    dst += BPS;
  }
}